

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitObjectSpreadNode
               (ParseNode *spreadNode,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  RegSlot R0;
  ParseNode *pnode;
  ParseNodeUni *pPVar1;
  ByteCodeWriter *this;
  ParseNode *exprNode;
  RegSlot fromObjectLocation;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot objectLocation_local;
  ParseNode *spreadNode_local;
  
  pPVar1 = ParseNode::AsParseNodeUni(spreadNode);
  pnode = pPVar1->pnode1;
  Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  R0 = pnode->location;
  this = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg2(this,SpreadObjectLiteral,R0,objectLocation);
  FuncInfo::ReleaseLoc(funcInfo,pnode);
  return;
}

Assistant:

void EmitObjectSpreadNode(ParseNode *spreadNode, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Js::RegSlot fromObjectLocation;
    ParseNode *exprNode = spreadNode->AsParseNodeUni()->pnode1;
    Emit(exprNode, byteCodeGenerator, funcInfo, false);
    fromObjectLocation = exprNode->location;
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::SpreadObjectLiteral, fromObjectLocation, objectLocation);
    funcInfo->ReleaseLoc(exprNode);
}